

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_parser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  xmlParserCtxtPtr pxVar15;
  xmlChar *pxVar16;
  size_t sVar17;
  xmlDocPtr pxVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  xmlDocPtr pxVar22;
  undefined8 uVar23;
  xmlNodePtr pxVar24;
  long lVar25;
  xmlChar *pxVar26;
  xmlDocPtr val;
  long lVar27;
  undefined4 uVar28;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int n_ctx;
  uint uVar29;
  uint no;
  int *piVar30;
  bool bVar31;
  xmlDocPtr in_RSI;
  uint uVar32;
  char *pcVar33;
  undefined4 *puVar34;
  int test_ret_10;
  uint uVar35;
  ulong uVar36;
  int n_ctxt;
  uint uVar37;
  undefined8 in_stack_fffffffffffffee8;
  uint *local_108;
  int test_ret_2;
  int local_f4;
  undefined8 local_f0;
  int local_d8;
  int local_d4;
  int test_ret;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int test_ret_1;
  uint local_a4;
  int test_ret_7;
  int local_9c;
  int test_ret_6;
  int test_ret_5;
  int test_ret_4;
  int local_8c;
  int local_88;
  int local_84;
  int test_ret_3;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int test_ret_8;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  _test_ret_2 = in_RSI;
  if (quiet == '\0') {
    puts("Testing parser : 61 of 70 functions ...");
    _test_ret_2 = in_RSI;
  }
  local_d8 = 0;
  pxVar22 = (xmlDocPtr)0x0;
  while (iVar3 = (int)pxVar22, iVar3 != 3) {
    iVar1 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(iVar3,(int)_test_ret_2);
    xmlByteConsumed();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlByteConsumed",(ulong)(uint)(iVar2 - iVar1));
      local_d8 = local_d8 + 1;
      printf(" %d");
      putchar(10);
      _test_ret_2 = pxVar22;
    }
    pxVar22 = (xmlDocPtr)(ulong)(iVar3 + 1);
  }
  function_tests = function_tests + 1;
  bVar31 = true;
  while (bVar31) {
    iVar3 = xmlMemBlocks();
    xmlClearNodeInfoSeq(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar31 = false;
    printf("Leak of %d blocks found in xmlClearNodeInfoSeq");
    _test_ret_2 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d8 = local_d8 + 1;
  }
  function_tests = function_tests + 1;
  local_cc = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar37,(int)_test_ret_2);
    xmlClearParserCtxt();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlClearParserCtxt",(ulong)(uint)(iVar1 - iVar3));
      local_cc = local_cc + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar16 = gen_const_xmlChar_ptr(uVar37,(int)_test_ret_2);
    xmlCreateDocParserCtxt(pxVar16);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateDocParserCtxt",(ulong)(uint)(iVar1 - iVar3));
      test_ret = test_ret + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_c4 = 0;
  for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
    for (iVar1 = 0; iVar1 != 3; iVar1 = iVar1 + 1) {
      for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
        for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
          pxVar22 = (xmlDocPtr)0x0;
          while (iVar2 = (int)pxVar22, iVar2 != 6) {
            iVar4 = xmlMemBlocks();
            if (iVar3 == 0) {
              local_108 = (uint *)__xmlDefaultSAXHandler();
            }
            else {
              local_108 = (uint *)0x0;
            }
            piVar30 = &call_tests;
            if (iVar1 != 0) {
              if (iVar1 == 1) {
                piVar30 = (int *)0xffffffffffffffff;
              }
              else {
                piVar30 = (int *)0x0;
              }
            }
            if (uVar37 == 0) {
              bVar31 = false;
              pcVar33 = "foo";
            }
            else if (uVar37 == 2) {
              bVar31 = false;
              pcVar33 = "test/ent2";
            }
            else if (uVar37 == 1) {
              bVar31 = false;
              pcVar33 = "<foo/>";
            }
            else {
              bVar31 = true;
              pcVar33 = (char *)0x0;
            }
            iVar5 = gen_int(uVar35,(int)_test_ret_2);
            gen_fileoutput(iVar2,(int)_test_ret_2);
            if ((bVar31) || (sVar17 = strlen(pcVar33), iVar5 <= (int)sVar17 + 1)) {
              xmlCreatePushParserCtxt(local_108,piVar30,pcVar33,iVar5);
              xmlFreeParserCtxt();
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              _test_ret_2 = (xmlDocPtr)piVar30;
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar5 - iVar4));
                local_c4 = local_c4 + 1;
                printf(" %d",iVar3);
                printf(" %d",iVar1);
                printf(" %d",(ulong)uVar37);
                printf(" %d",(ulong)uVar35);
                printf(" %d");
                putchar(10);
                _test_ret_2 = pxVar22;
              }
            }
            pxVar22 = (xmlDocPtr)(ulong)(iVar2 + 1);
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_c0 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
      for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
        uVar20 = 0;
        while (uVar35 = (uint)uVar20, uVar35 != 4) {
          pxVar22 = (xmlDocPtr)0x0;
          while( true ) {
            iVar4 = (int)_test_ret_2;
            iVar2 = (int)pxVar22;
            if (iVar2 == 5) break;
            iVar5 = xmlMemBlocks();
            pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar4);
            _test_ret_2 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar3,iVar4);
            pcVar33 = gen_filepath(iVar1,iVar4);
            if (uVar35 < 3) {
              uVar23 = (&DAT_00167d78)[uVar20];
            }
            else {
              uVar23 = 0;
            }
            gen_parseroptions(iVar2,iVar4);
            pxVar18 = (xmlDocPtr)xmlCtxtReadDoc(pxVar15,_test_ret_2,pcVar33,uVar23);
            desret_xmlDocPtr(pxVar18);
            call_tests = call_tests + 1;
            if (pxVar15 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt();
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar5 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlCtxtReadDoc",(ulong)(uint)(iVar4 - iVar5));
              local_c0 = local_c0 + 1;
              printf(" %d",(ulong)uVar37);
              printf(" %d",iVar3);
              printf(" %d",iVar1);
              printf(" %d",uVar20);
              printf(" %d");
              putchar(10);
              _test_ret_2 = pxVar22;
            }
            pxVar22 = (xmlDocPtr)(ulong)(iVar2 + 1);
          }
          uVar20 = (ulong)(uVar35 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_c8 = 0;
  for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
    uVar20 = 0;
    while (iVar1 = (int)uVar20, iVar1 != 8) {
      uVar19 = 0;
      while (uVar37 = (uint)uVar19, uVar37 != 4) {
        pxVar22 = (xmlDocPtr)0x0;
        while( true ) {
          iVar4 = (int)_test_ret_2;
          iVar2 = (int)pxVar22;
          if (iVar2 == 5) break;
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlParserCtxtPtr(iVar3,iVar4);
          _test_ret_2 = (xmlDocPtr)gen_filepath(iVar1,iVar4);
          if (uVar37 < 3) {
            uVar23 = (&DAT_00167d78)[uVar19];
          }
          else {
            uVar23 = 0;
          }
          iVar4 = gen_parseroptions(iVar2,iVar4);
          pxVar18 = (xmlDocPtr)xmlCtxtReadFile(pxVar15,_test_ret_2,uVar23,iVar4);
          desret_xmlDocPtr(pxVar18);
          call_tests = call_tests + 1;
          if (pxVar15 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt();
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar5 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCtxtReadFile",(ulong)(uint)(iVar4 - iVar5));
            local_c8 = local_c8 + 1;
            printf(" %d",iVar3);
            printf(" %d",uVar20);
            printf(" %d",uVar19);
            printf(" %d");
            putchar(10);
            _test_ret_2 = pxVar22;
          }
          pxVar22 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar19 = (ulong)(uVar37 + 1);
      }
      uVar20 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_bc = 0;
  for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
    for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
      for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
        for (uVar32 = 0; uVar32 != 8; uVar32 = uVar32 + 1) {
          for (uVar20 = 0; (int)uVar20 != 4; uVar20 = (ulong)((int)uVar20 + 1)) {
            for (uVar29 = 0; uVar29 != 5; uVar29 = uVar29 + 1) {
              iVar1 = xmlMemBlocks();
              pxVar15 = gen_xmlParserCtxtPtr(iVar3,(int)_test_ret_2);
              if (uVar37 == 0) {
                bVar31 = false;
                pcVar33 = "foo";
              }
              else if (uVar37 == 2) {
                bVar31 = false;
                pcVar33 = "test/ent2";
              }
              else if (uVar37 == 1) {
                bVar31 = false;
                pcVar33 = "<foo/>";
              }
              else {
                bVar31 = true;
                pcVar33 = (char *)0x0;
              }
              iVar2 = gen_int(uVar35,(int)_test_ret_2);
              pcVar21 = gen_filepath(uVar32,(int)_test_ret_2);
              gen_parseroptions(uVar29,(int)_test_ret_2);
              if ((bVar31) || (sVar17 = strlen(pcVar33), iVar2 <= (int)sVar17 + 1)) {
                pxVar22 = (xmlDocPtr)xmlCtxtReadMemory(pxVar15,pcVar33,iVar2,pcVar21);
                desret_xmlDocPtr(pxVar22);
                call_tests = call_tests + 1;
                _test_ret_2 = (xmlDocPtr)pcVar33;
                if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                  xmlFreeParserCtxt();
                  _test_ret_2 = (xmlDocPtr)pcVar33;
                }
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlCtxtReadMemory",(ulong)(uint)(iVar2 - iVar1)
                        );
                  local_bc = local_bc + 1;
                  printf(" %d",iVar3);
                  printf(" %d",(ulong)uVar37);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",(ulong)uVar32);
                  printf(" %d",uVar20);
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar29;
                  printf(" %d");
                  putchar(10);
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  pxVar22 = (xmlDocPtr)0x0;
  while (iVar1 = (int)pxVar22, iVar1 != 3) {
    iVar2 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(iVar1,(int)_test_ret_2);
    xmlCtxtReset();
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar2 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtReset",(ulong)(uint)(iVar4 - iVar2));
      iVar3 = iVar3 + 1;
      printf(" %d");
      putchar(10);
      _test_ret_2 = pxVar22;
    }
    pxVar22 = (xmlDocPtr)(ulong)(iVar1 + 1);
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
      for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
        for (uVar32 = 0; uVar32 != 8; uVar32 = uVar32 + 1) {
          for (uVar29 = 0; uVar29 != 4; uVar29 = uVar29 + 1) {
            iVar4 = xmlMemBlocks();
            pxVar15 = gen_xmlParserCtxtPtr(iVar2,(int)_test_ret_2);
            if (uVar37 == 0) {
              bVar31 = false;
              pcVar33 = "foo";
            }
            else if (uVar37 == 2) {
              bVar31 = false;
              pcVar33 = "test/ent2";
            }
            else if (uVar37 == 1) {
              bVar31 = false;
              pcVar33 = "<foo/>";
            }
            else {
              bVar31 = true;
              pcVar33 = (char *)0x0;
            }
            iVar5 = gen_int(uVar35,(int)_test_ret_2);
            pcVar21 = gen_filepath(uVar32,(int)_test_ret_2);
            if ((bVar31) || (sVar17 = strlen(pcVar33), iVar5 <= (int)sVar17 + 1)) {
              xmlCtxtResetPush(pxVar15,pcVar33,iVar5,pcVar21);
              call_tests = call_tests + 1;
              _test_ret_2 = (xmlDocPtr)pcVar33;
              if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt();
                _test_ret_2 = (xmlDocPtr)pcVar33;
              }
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlCtxtResetPush",(ulong)(uint)(iVar5 - iVar4));
                iVar1 = iVar1 + 1;
                printf(" %d",iVar2);
                printf(" %d",(ulong)uVar37);
                printf(" %d",(ulong)uVar35);
                printf(" %d",(ulong)uVar32);
                _test_ret_2 = (xmlDocPtr)(ulong)uVar29;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar22 = (xmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)_test_ret_2;
      iVar5 = (int)pxVar22;
      if (iVar5 == 5) break;
      iVar6 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar4);
      uVar35 = gen_parseroptions(iVar5,iVar4);
      _test_ret_2 = (xmlDocPtr)(ulong)uVar35;
      xmlCtxtUseOptions();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar6 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCtxtUseOptions",(ulong)(uint)(iVar4 - iVar6));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        _test_ret_2 = pxVar22;
      }
      pxVar22 = (xmlDocPtr)(ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (uVar35 = (uint)uVar20, uVar35 != 4) {
      pxVar22 = (xmlDocPtr)0x0;
      while( true ) {
        iVar5 = (int)_test_ret_2;
        iVar6 = (int)pxVar22;
        if (iVar6 == 2) break;
        iVar7 = xmlMemBlocks();
        pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar5);
        if (uVar35 < 3) {
          _test_ret_2 = (xmlDocPtr)(&DAT_00167d78)[uVar20];
        }
        else {
          _test_ret_2 = (xmlDocPtr)0x0;
        }
        xmlGetFeature(pxVar15,_test_ret_2,0);
        call_tests = call_tests + 1;
        if (pxVar15 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt();
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar7 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetFeature",(ulong)(uint)(iVar5 - iVar7));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          _test_ret_2 = pxVar22;
        }
        pxVar22 = (xmlDocPtr)(ulong)(iVar6 + 1);
      }
      uVar20 = (ulong)(uVar35 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    bVar31 = true;
    while (bVar31) {
      iVar7 = xmlMemBlocks();
      _test_ret_2 = (xmlDocPtr)0x0;
      xmlGetFeaturesList();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 == iVar8) break;
      iVar8 = xmlMemBlocks();
      bVar31 = false;
      printf("Leak of %d blocks found in xmlGetFeaturesList",(ulong)(uint)(iVar8 - iVar7));
      iVar5 = iVar5 + 1;
      printf(" %d");
      _test_ret_2 = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  uVar37 = 0xffffffff;
  local_d4 = 0;
  while (uVar37 != 3) {
    iVar6 = xmlMemBlocks();
    uVar37 = uVar37 + 1;
    xmlHasFeature();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasFeature",(ulong)(uint)(iVar7 - iVar6));
      local_d4 = local_d4 + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
      puVar34 = &DAT_001540b0;
      for (uVar37 = 0; iVar8 = (int)_test_ret_2, uVar37 != 4; uVar37 = uVar37 + 1) {
        if (iVar6 == 0) {
          uVar23 = __xmlDefaultSAXHandler();
        }
        else {
          uVar23 = 0;
        }
        _test_ret_2 = (xmlDocPtr)gen_xmlParserInputBufferPtr(iVar7,iVar8);
        uVar28 = 0xffffffff;
        if (uVar37 < 3) {
          uVar28 = *puVar34;
        }
        pxVar24 = (xmlNodePtr)xmlIOParseDTD(uVar23,_test_ret_2,uVar28);
        desret_xmlNodePtr(pxVar24);
        call_tests = call_tests + 1;
        xmlFreeParserInputBuffer();
        xmlResetLastError();
        puVar34 = puVar34 + 1;
      }
    }
  }
  function_tests = function_tests + 1;
  local_d4 = local_d4 + local_d8 +
             iVar1 + iVar2 + iVar4 + iVar5 +
             local_c8 + local_bc + iVar3 + local_c4 + local_c0 + local_cc + test_ret;
  bVar31 = true;
  while (bVar31) {
    iVar3 = xmlMemBlocks();
    xmlInitNodeInfoSeq(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 == iVar1) break;
    xmlMemBlocks();
    bVar31 = false;
    printf("Leak of %d blocks found in xmlInitNodeInfoSeq");
    _test_ret_2 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d4 = local_d4 + 1;
  }
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlInitParser();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar1 = xmlMemBlocks();
  if (iVar3 != iVar1) {
    iVar2 = xmlMemBlocks();
    _test_ret_2 = (xmlDocPtr)(ulong)(uint)(iVar2 - iVar3);
    printf("Leak of %d blocks found in xmlInitParser");
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar37,(int)_test_ret_2);
    xmlInitParserCtxt(pxVar15);
    call_tests = call_tests + 1;
    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar15);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar2 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlInitParserCtxt",(ulong)(uint)(iVar4 - iVar2));
      local_78 = local_78 + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_7c = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    iVar2 = xmlMemBlocks();
    iVar4 = gen_int(uVar37,(int)_test_ret_2);
    xmlKeepBlanksDefault(iVar4);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar2 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlKeepBlanksDefault",(ulong)(uint)(iVar4 - iVar2));
      local_7c = local_7c + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  pxVar22 = (xmlDocPtr)0x0;
  while (iVar2 = (int)pxVar22, iVar2 != 4) {
    iVar4 = xmlMemBlocks();
    iVar5 = gen_int(iVar2,(int)_test_ret_2);
    xmlLineNumbersDefault(iVar5);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLineNumbersDefault",(ulong)(uint)(iVar5 - iVar4));
      test_ret_3 = test_ret_3 + 1;
      printf(" %d");
      putchar(10);
      _test_ret_2 = pxVar22;
    }
    pxVar22 = (xmlDocPtr)(ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  for (uVar37 = 0; uVar37 != 8; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (uVar35 = (uint)uVar20, uVar35 != 4) {
      pxVar22 = (xmlDocPtr)0x0;
      while( true ) {
        iVar2 = (int)_test_ret_2;
        iVar4 = (int)pxVar22;
        if (iVar4 == 3) break;
        iVar5 = xmlMemBlocks();
        pcVar33 = gen_filepath(uVar37,iVar2);
        if (uVar35 < 3) {
          _test_ret_2 = (xmlDocPtr)(&DAT_00167d78)[uVar20];
        }
        else {
          _test_ret_2 = (xmlDocPtr)0x0;
        }
        pxVar15 = gen_xmlParserCtxtPtr(iVar4,iVar2);
        uVar23 = xmlLoadExternalEntity(pcVar33,_test_ret_2,pxVar15);
        xmlFreeInputStream(uVar23);
        call_tests = call_tests + 1;
        if (pxVar15 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar15);
        }
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar5 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlLoadExternalEntity",(ulong)(uint)(iVar2 - iVar5));
          local_3c = local_3c + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          _test_ret_2 = pxVar22;
        }
        pxVar22 = (xmlDocPtr)(ulong)(iVar4 + 1);
      }
      uVar20 = (ulong)(uVar35 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_40 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar2 = (int)uVar20, iVar2 != 8) {
      pxVar22 = (xmlDocPtr)0x0;
      local_108 = &DAT_001540b0;
      while( true ) {
        iVar4 = (int)_test_ret_2;
        uVar35 = (uint)pxVar22;
        if (uVar35 == 4) break;
        iVar5 = xmlMemBlocks();
        pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar4);
        pxVar18 = (xmlDocPtr)gen_xmlParserInputBufferPtr(iVar2,iVar4);
        uVar19 = 0xffffffffffffffff;
        if (uVar35 < 3) {
          uVar19 = (ulong)*local_108;
        }
        _test_ret_2 = pxVar18;
        lVar25 = xmlNewIOInputStream(pxVar15,pxVar18,uVar19);
        if (lVar25 != 0) {
          pxVar18 = (xmlDocPtr)0x0;
        }
        xmlFreeInputStream(lVar25);
        call_tests = call_tests + 1;
        if (pxVar15 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar15);
        }
        xmlFreeParserInputBuffer(pxVar18);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar5 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewIOInputStream",(ulong)(uint)(iVar4 - iVar5));
          local_40 = local_40 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          _test_ret_2 = pxVar22;
        }
        pxVar22 = (xmlDocPtr)(ulong)(uVar35 + 1);
        local_108 = local_108 + 1;
      }
      uVar20 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  uVar23 = xmlNewParserCtxt();
  xmlFreeParserCtxt(uVar23);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar2 != iVar4) {
    iVar5 = xmlMemBlocks();
    _test_ret_2 = (xmlDocPtr)(ulong)(uint)(iVar5 - iVar2);
    printf("Leak of %d blocks found in xmlNewParserCtxt");
    putchar(10);
  }
  local_a4 = (uint)(iVar2 != iVar4);
  function_tests = function_tests + 1;
  local_c0 = 0;
  for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
    for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
      for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
        for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
          for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
            bVar31 = true;
            while (iVar8 = (int)_test_ret_2, bVar31) {
              iVar9 = xmlMemBlocks();
              pxVar22 = gen_xmlDocPtr(iVar2,iVar8);
              if (iVar4 == 0) {
                _test_ret_2 = (xmlDocPtr)__xmlDefaultSAXHandler();
              }
              else {
                _test_ret_2 = (xmlDocPtr)0x0;
              }
              piVar30 = &call_tests;
              if (iVar5 != 0) {
                if (iVar5 == 1) {
                  piVar30 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar30 = (int *)0x0;
                }
              }
              gen_int(iVar6,iVar8);
              gen_const_xmlChar_ptr(iVar7,iVar8);
              pxVar18 = (xmlDocPtr)__xmlDefaultSAXHandler();
              if (_test_ret_2 == pxVar18) {
                piVar30 = (int *)0x0;
              }
              xmlParseBalancedChunkMemory(pxVar22,_test_ret_2,piVar30);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar22,_test_ret_2,nr);
              xmlResetLastError();
              iVar8 = xmlMemBlocks();
              if (iVar9 == iVar8) break;
              iVar8 = xmlMemBlocks();
              bVar31 = false;
              printf("Leak of %d blocks found in xmlParseBalancedChunkMemory",
                     (ulong)(uint)(iVar8 - iVar9));
              local_c0 = local_c0 + 1;
              printf(" %d",iVar2);
              printf(" %d",iVar4);
              printf(" %d",iVar5);
              printf(" %d",iVar6);
              printf(" %d");
              _test_ret_2 = (xmlDocPtr)0x0;
              printf(" %d");
              putchar(10);
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
      for (uVar35 = 0; uVar35 != 3; uVar35 = uVar35 + 1) {
        for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
          for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
            bVar31 = true;
            while (bVar31) {
              uVar29 = 0;
              while( true ) {
                uVar28 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
                iVar6 = (int)_test_ret_2;
                if (uVar29 == 4) break;
                iVar7 = xmlMemBlocks();
                pxVar22 = gen_xmlDocPtr(iVar4,iVar6);
                if (uVar37 == 0) {
                  _test_ret_2 = (xmlDocPtr)__xmlDefaultSAXHandler();
                }
                else {
                  _test_ret_2 = (xmlDocPtr)0x0;
                }
                piVar30 = &call_tests;
                if (uVar35 != 0) {
                  if (uVar35 == 1) {
                    piVar30 = (int *)0xffffffffffffffff;
                  }
                  else {
                    piVar30 = (int *)0x0;
                  }
                }
                iVar8 = gen_int(uVar32,iVar6);
                pxVar16 = gen_const_xmlChar_ptr(iVar5,iVar6);
                iVar6 = gen_int(uVar29,iVar6);
                pxVar18 = (xmlDocPtr)__xmlDefaultSAXHandler();
                if (_test_ret_2 == pxVar18) {
                  piVar30 = (int *)0x0;
                }
                in_stack_fffffffffffffee8 = CONCAT44(uVar28,iVar6);
                xmlParseBalancedChunkMemoryRecover
                          (pxVar22,_test_ret_2,piVar30,iVar8,pxVar16,0,in_stack_fffffffffffffee8);
                call_tests = call_tests + 1;
                des_xmlDocPtr((int)pxVar22,_test_ret_2,nr_00);
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar7 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlParseBalancedChunkMemoryRecover",
                         (ulong)(uint)(iVar6 - iVar7));
                  iVar2 = iVar2 + 1;
                  printf(" %d",iVar4);
                  printf(" %d",(ulong)uVar37);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",(ulong)uVar32);
                  printf(" %d",iVar5);
                  printf(" %d",0);
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar29;
                  printf(" %d");
                  putchar(10);
                }
                uVar29 = uVar29 + 1;
              }
              bVar31 = false;
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
      uVar20 = 0;
      while (iVar4 = (int)uVar20, iVar4 != 4) {
        for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlParserCtxtPtr(uVar37,(int)_test_ret_2);
          if (uVar35 == 0) {
            bVar31 = false;
            pcVar33 = "foo";
          }
          else if (uVar35 == 2) {
            bVar31 = false;
            pcVar33 = "test/ent2";
          }
          else if (uVar35 == 1) {
            bVar31 = false;
            pcVar33 = "<foo/>";
          }
          else {
            bVar31 = true;
            pcVar33 = (char *)0x0;
          }
          iVar6 = gen_int(iVar4,(int)_test_ret_2);
          gen_int(uVar32,(int)_test_ret_2);
          if ((bVar31) || (sVar17 = strlen(pcVar33), iVar6 <= (int)sVar17 + 1)) {
            xmlParseChunk(pxVar15,pcVar33,iVar6);
            if (pxVar15 == (xmlParserCtxtPtr)0x0) {
              call_tests = call_tests + 1;
              _test_ret_2 = (xmlDocPtr)pcVar33;
            }
            else {
              xmlFreeDoc(pxVar15->myDoc);
              pxVar15->myDoc = (xmlDocPtr)0x0;
              call_tests = call_tests + 1;
              xmlFreeParserCtxt();
              _test_ret_2 = (xmlDocPtr)pcVar33;
            }
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar5 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlParseChunk",(ulong)(uint)(iVar6 - iVar5));
              test_ret = test_ret + 1;
              printf(" %d",(ulong)uVar37);
              printf(" %d",(ulong)uVar35);
              printf(" %d",uVar20);
              _test_ret_2 = (xmlDocPtr)(ulong)uVar32;
              printf(" %d");
              putchar(10);
            }
          }
        }
        uVar20 = (ulong)(iVar4 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_cc = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar4 = (int)uVar20, iVar4 != 5) {
      for (iVar5 = 0; iVar5 != 5; iVar5 = iVar5 + 1) {
        bVar31 = true;
        while (iVar6 = (int)_test_ret_2, bVar31) {
          iVar7 = xmlMemBlocks();
          pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar6);
          _test_ret_2 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar4,iVar6);
          pxVar16 = gen_const_xmlChar_ptr(iVar5,iVar6);
          xmlParseCtxtExternalEntity(pxVar15,_test_ret_2,pxVar16,0);
          call_tests = call_tests + 1;
          if (pxVar15 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt();
          }
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar7 == iVar6) break;
          iVar6 = xmlMemBlocks();
          bVar31 = false;
          printf("Leak of %d blocks found in xmlParseCtxtExternalEntity",
                 (ulong)(uint)(iVar6 - iVar7));
          local_cc = local_cc + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          _test_ret_2 = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
      }
      uVar20 = (ulong)(iVar4 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    pxVar22 = (xmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)_test_ret_2;
      iVar5 = (int)pxVar22;
      if (iVar5 == 5) break;
      iVar6 = xmlMemBlocks();
      pxVar16 = gen_const_xmlChar_ptr(uVar37,iVar4);
      _test_ret_2 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar4);
      pxVar24 = (xmlNodePtr)xmlParseDTD(pxVar16);
      desret_xmlNodePtr(pxVar24);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar6 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParseDTD",(ulong)(uint)(iVar4 - iVar6));
        local_54 = local_54 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        _test_ret_2 = pxVar22;
      }
      pxVar22 = (xmlDocPtr)(ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_84 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    iVar4 = xmlMemBlocks();
    pxVar16 = gen_const_xmlChar_ptr(uVar37,(int)_test_ret_2);
    pxVar22 = (xmlDocPtr)xmlParseDoc(pxVar16);
    desret_xmlDocPtr(pxVar22);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseDoc",(ulong)(uint)(iVar5 - iVar4));
      local_84 = local_84 + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_88 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar4 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(uVar37,(int)_test_ret_2);
    xmlParseDocument();
    if (pxVar15 == (xmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar15->myDoc);
      pxVar15->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseDocument",(ulong)(uint)(iVar5 - iVar4));
      local_88 = local_88 + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar37 = 0; uVar37 != 8; uVar37 = uVar37 + 1) {
    iVar4 = xmlMemBlocks();
    pcVar33 = gen_filepath(uVar37,(int)_test_ret_2);
    pxVar22 = (xmlDocPtr)xmlParseEntity(pcVar33);
    desret_xmlDocPtr(pxVar22);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseEntity",(ulong)(uint)(iVar5 - iVar4));
      local_8c = local_8c + 1;
      _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  pxVar22 = (xmlDocPtr)0x0;
  while (iVar4 = (int)pxVar22, iVar4 != 3) {
    iVar5 = xmlMemBlocks();
    pxVar15 = gen_xmlParserCtxtPtr(iVar4,(int)_test_ret_2);
    xmlParseExtParsedEnt();
    if (pxVar15 == (xmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar15->myDoc);
      pxVar15->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      xmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseExtParsedEnt",(ulong)(uint)(iVar6 - iVar5));
      test_ret_4 = test_ret_4 + 1;
      printf(" %d");
      putchar(10);
      _test_ret_2 = pxVar22;
    }
    pxVar22 = (xmlDocPtr)(ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  local_bc = 0;
  uVar20 = 0;
  while (iVar4 = (int)uVar20, iVar4 != 4) {
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
        for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
          for (iVar6 = 0; iVar6 != 5; iVar6 = iVar6 + 1) {
            for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
              bVar31 = true;
              while (iVar8 = (int)_test_ret_2, bVar31) {
                iVar9 = xmlMemBlocks();
                pxVar22 = gen_xmlDocPtr(iVar4,iVar8);
                if (iVar5 == 0) {
                  _test_ret_2 = (xmlDocPtr)__xmlDefaultSAXHandler();
                }
                else {
                  _test_ret_2 = (xmlDocPtr)0x0;
                }
                piVar30 = &call_tests;
                if (uVar37 != 0) {
                  if (uVar37 == 1) {
                    piVar30 = (int *)0xffffffffffffffff;
                  }
                  else {
                    piVar30 = (int *)0x0;
                  }
                }
                iVar10 = gen_int(uVar35,iVar8);
                pxVar16 = gen_const_xmlChar_ptr(iVar6,iVar8);
                pxVar26 = gen_const_xmlChar_ptr(iVar7,iVar8);
                xmlParseExternalEntity(pxVar22,_test_ret_2,piVar30,iVar10,pxVar16,pxVar26,0);
                call_tests = call_tests + 1;
                des_xmlDocPtr((int)pxVar22,_test_ret_2,nr_01);
                xmlResetLastError();
                iVar8 = xmlMemBlocks();
                if (iVar9 == iVar8) break;
                iVar8 = xmlMemBlocks();
                bVar31 = false;
                printf("Leak of %d blocks found in xmlParseExternalEntity",
                       (ulong)(uint)(iVar8 - iVar9));
                local_bc = local_bc + 1;
                printf(" %d",uVar20);
                printf(" %d",iVar5);
                printf(" %d",(ulong)uVar37);
                printf(" %d",(ulong)uVar35);
                printf(" %d",iVar6);
                printf(" %d");
                _test_ret_2 = (xmlDocPtr)0x0;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
    uVar20 = (ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  pxVar22 = (xmlDocPtr)0x0;
  while (iVar4 = (int)pxVar22, iVar4 != 8) {
    iVar5 = xmlMemBlocks();
    pcVar33 = gen_filepath(iVar4,(int)_test_ret_2);
    pxVar18 = (xmlDocPtr)xmlParseFile(pcVar33);
    desret_xmlDocPtr(pxVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseFile",(ulong)(uint)(iVar6 - iVar5));
      test_ret_5 = test_ret_5 + 1;
      printf(" %d");
      putchar(10);
      _test_ret_2 = pxVar22;
    }
    pxVar22 = (xmlDocPtr)(ulong)(iVar4 + 1);
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar20 = 0;
  while (iVar5 = (int)uVar20, iVar5 != 3) {
    uVar19 = 0;
    while (uVar37 = (uint)uVar19, uVar37 != 4) {
      uVar36 = 0;
      while (iVar6 = (int)uVar36, iVar6 != 4) {
        for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
          bVar31 = true;
          while (iVar8 = (int)_test_ret_2, bVar31) {
            iVar9 = xmlMemBlocks();
            _test_ret_2 = (xmlDocPtr)gen_xmlNodePtr(iVar5,iVar8);
            if (uVar37 < 3) {
              uVar23 = (&DAT_00167d78)[uVar19];
            }
            else {
              uVar23 = 0;
            }
            iVar10 = gen_int(iVar6,iVar8);
            iVar8 = gen_parseroptions(iVar7,iVar8);
            xmlParseInNodeContext(_test_ret_2,uVar23,iVar10,iVar8,0);
            call_tests = call_tests + 1;
            des_xmlNodePtr(iVar5,(xmlNodePtr)_test_ret_2,nr_02);
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar9 == iVar8) break;
            iVar8 = xmlMemBlocks();
            bVar31 = false;
            printf("Leak of %d blocks found in xmlParseInNodeContext",(ulong)(uint)(iVar8 - iVar9));
            iVar4 = iVar4 + 1;
            printf(" %d",uVar20);
            printf(" %d",uVar19);
            printf(" %d",uVar36);
            printf(" %d");
            _test_ret_2 = (xmlDocPtr)0x0;
            printf(" %d");
            putchar(10);
          }
        }
        uVar36 = (ulong)(iVar6 + 1);
      }
      uVar19 = (ulong)(uVar37 + 1);
    }
    uVar20 = (ulong)(iVar5 + 1);
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar22 = (xmlDocPtr)0x0;
    while (iVar5 = (int)pxVar22, iVar5 != 4) {
      iVar6 = xmlMemBlocks();
      if (uVar37 == 0) {
        bVar31 = false;
        pcVar33 = "foo";
      }
      else if (uVar37 == 2) {
        bVar31 = false;
        pcVar33 = "test/ent2";
      }
      else if (uVar37 == 1) {
        bVar31 = false;
        pcVar33 = "<foo/>";
      }
      else {
        bVar31 = true;
        pcVar33 = (char *)0x0;
      }
      uVar35 = gen_int(iVar5,(int)_test_ret_2);
      if ((bVar31) || (sVar17 = strlen(pcVar33), (int)uVar35 <= (int)sVar17 + 1)) {
        _test_ret_2 = (xmlDocPtr)(ulong)uVar35;
        pxVar18 = (xmlDocPtr)xmlParseMemory(pcVar33);
        desret_xmlDocPtr(pxVar18);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParseMemory",(ulong)(uint)(iVar7 - iVar6));
          local_70 = local_70 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d");
          putchar(10);
          _test_ret_2 = pxVar22;
        }
      }
      pxVar22 = (xmlDocPtr)(ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  local_64 = 0;
  do {
    if (iVar5 == 3) {
      function_tests = function_tests + 1;
      local_68 = 0;
      bVar31 = true;
LAB_0012adc8:
      do {
        if (!bVar31) {
          function_tests = function_tests + 1;
          local_6c = 0;
          bVar31 = true;
LAB_0012ae69:
          do {
            if (!bVar31) {
              function_tests = function_tests + 1;
              bVar31 = true;
              local_58 = 0;
              while (bVar31) {
                pxVar22 = (xmlDocPtr)0x0;
                while( true ) {
                  iVar5 = (int)_test_ret_2;
                  iVar6 = (int)pxVar22;
                  if (iVar6 == 4) break;
                  iVar7 = xmlMemBlocks();
                  uVar37 = gen_int(iVar6,iVar5);
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  xmlParserInputGrow(0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar5 = xmlMemBlocks();
                  if (iVar7 != iVar5) {
                    iVar5 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlParserInputGrow",
                           (ulong)(uint)(iVar5 - iVar7));
                    local_58 = local_58 + 1;
                    printf(" %d",0);
                    printf(" %d");
                    putchar(10);
                    _test_ret_2 = pxVar22;
                  }
                  pxVar22 = (xmlDocPtr)(ulong)(iVar6 + 1);
                }
                bVar31 = false;
              }
              function_tests = function_tests + 1;
              bVar31 = true;
              local_5c = 0;
              while (bVar31) {
                pxVar22 = (xmlDocPtr)0x0;
                while( true ) {
                  iVar5 = (int)_test_ret_2;
                  iVar6 = (int)pxVar22;
                  if (iVar6 == 4) break;
                  iVar7 = xmlMemBlocks();
                  uVar37 = gen_int(iVar6,iVar5);
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  xmlParserInputRead(0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar5 = xmlMemBlocks();
                  if (iVar7 != iVar5) {
                    iVar5 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlParserInputRead",
                           (ulong)(uint)(iVar5 - iVar7));
                    local_5c = local_5c + 1;
                    printf(" %d",0);
                    printf(" %d");
                    putchar(10);
                    _test_ret_2 = pxVar22;
                  }
                  pxVar22 = (xmlDocPtr)(ulong)(iVar6 + 1);
                }
                bVar31 = false;
              }
              function_tests = function_tests + 1;
              test_ret_6 = 0;
              for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
                iVar5 = xmlMemBlocks();
                iVar6 = gen_int(uVar37,(int)_test_ret_2);
                xmlPedanticParserDefault(iVar6);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlPedanticParserDefault",
                         (ulong)(uint)(iVar6 - iVar5));
                  test_ret_6 = test_ret_6 + 1;
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  printf(" %d");
                  putchar(10);
                }
              }
              function_tests = function_tests + 1;
              local_c8 = 0;
              for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
                for (uVar35 = 0; uVar35 != 8; uVar35 = uVar35 + 1) {
                  uVar20 = 0;
                  while (uVar32 = (uint)uVar20, uVar32 != 4) {
                    pxVar22 = (xmlDocPtr)0x0;
                    while( true ) {
                      iVar6 = (int)_test_ret_2;
                      iVar5 = (int)pxVar22;
                      if (iVar5 == 5) break;
                      iVar7 = xmlMemBlocks();
                      pxVar16 = gen_const_xmlChar_ptr(uVar37,iVar6);
                      _test_ret_2 = (xmlDocPtr)gen_filepath(uVar35,iVar6);
                      if (uVar32 < 3) {
                        uVar23 = (&DAT_00167d78)[uVar20];
                      }
                      else {
                        uVar23 = 0;
                      }
                      iVar6 = gen_parseroptions(iVar5,iVar6);
                      pxVar18 = (xmlDocPtr)xmlReadDoc(pxVar16,_test_ret_2,uVar23,iVar6);
                      desret_xmlDocPtr(pxVar18);
                      call_tests = call_tests + 1;
                      xmlResetLastError();
                      iVar6 = xmlMemBlocks();
                      if (iVar7 != iVar6) {
                        iVar6 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlReadDoc",(ulong)(uint)(iVar6 - iVar7))
                        ;
                        local_c8 = local_c8 + 1;
                        printf(" %d",(ulong)uVar37);
                        printf(" %d",(ulong)uVar35);
                        printf(" %d",uVar20);
                        printf(" %d");
                        putchar(10);
                        _test_ret_2 = pxVar22;
                      }
                      pxVar22 = (xmlDocPtr)(ulong)(iVar5 + 1);
                    }
                    uVar20 = (ulong)(uVar32 + 1);
                  }
                }
              }
              function_tests = function_tests + 1;
              local_44 = 0;
              for (uVar37 = 0; uVar37 != 8; uVar37 = uVar37 + 1) {
                uVar20 = 0;
                while (uVar35 = (uint)uVar20, uVar35 != 4) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar5 = (int)_test_ret_2;
                    iVar6 = (int)pxVar22;
                    if (iVar6 == 5) break;
                    iVar7 = xmlMemBlocks();
                    pcVar33 = gen_filepath(uVar37,iVar5);
                    if (uVar35 < 3) {
                      _test_ret_2 = (xmlDocPtr)(&DAT_00167d78)[uVar20];
                    }
                    else {
                      _test_ret_2 = (xmlDocPtr)0x0;
                    }
                    iVar5 = gen_parseroptions(iVar6,iVar5);
                    pxVar18 = (xmlDocPtr)xmlReadFile(pcVar33,_test_ret_2,iVar5);
                    desret_xmlDocPtr(pxVar18);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar5 = xmlMemBlocks();
                    if (iVar7 != iVar5) {
                      iVar5 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlReadFile",(ulong)(uint)(iVar5 - iVar7));
                      local_44 = local_44 + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar6 + 1);
                  }
                  uVar20 = (ulong)(uVar35 + 1);
                }
              }
              function_tests = function_tests + 1;
              local_c4 = 0;
              for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
                for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
                  for (uVar32 = 0; uVar32 != 8; uVar32 = uVar32 + 1) {
                    uVar20 = 0;
                    while (uVar29 = (uint)uVar20, uVar29 != 4) {
                      for (no = 0; no != 5; no = no + 1) {
                        iVar5 = xmlMemBlocks();
                        if (uVar37 == 0) {
                          bVar31 = false;
                          pcVar33 = "foo";
                        }
                        else if (uVar37 == 2) {
                          bVar31 = false;
                          pcVar33 = "test/ent2";
                        }
                        else if (uVar37 == 1) {
                          bVar31 = false;
                          pcVar33 = "<foo/>";
                        }
                        else {
                          bVar31 = true;
                          pcVar33 = (char *)0x0;
                        }
                        uVar11 = gen_int(uVar35,(int)_test_ret_2);
                        pxVar22 = (xmlDocPtr)(ulong)uVar11;
                        pcVar21 = gen_filepath(uVar32,(int)_test_ret_2);
                        if (uVar29 < 3) {
                          uVar23 = (&DAT_00167d78)[uVar20];
                        }
                        else {
                          uVar23 = 0;
                        }
                        iVar6 = gen_parseroptions(no,(int)_test_ret_2);
                        if ((bVar31) || (sVar17 = strlen(pcVar33), (int)uVar11 <= (int)sVar17 + 1))
                        {
                          pxVar18 = (xmlDocPtr)xmlReadMemory(pcVar33,pxVar22,pcVar21,uVar23,iVar6);
                          desret_xmlDocPtr(pxVar18);
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar6 = xmlMemBlocks();
                          _test_ret_2 = pxVar22;
                          if (iVar5 != iVar6) {
                            iVar6 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlReadMemory",
                                   (ulong)(uint)(iVar6 - iVar5));
                            local_c4 = local_c4 + 1;
                            printf(" %d",(ulong)uVar37);
                            printf(" %d",(ulong)uVar35);
                            printf(" %d",(ulong)uVar32);
                            printf(" %d",uVar20);
                            _test_ret_2 = (xmlDocPtr)(ulong)no;
                            printf(" %d");
                            putchar(10);
                          }
                        }
                      }
                      uVar20 = (ulong)(uVar29 + 1);
                    }
                  }
                }
              }
              function_tests = function_tests + 1;
              local_9c = 0;
              for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
                iVar5 = xmlMemBlocks();
                pxVar16 = gen_const_xmlChar_ptr(uVar37,(int)_test_ret_2);
                pxVar22 = (xmlDocPtr)xmlRecoverDoc(pxVar16);
                desret_xmlDocPtr(pxVar22);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlRecoverDoc",(ulong)(uint)(iVar6 - iVar5));
                  local_9c = local_9c + 1;
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  printf(" %d");
                  putchar(10);
                }
              }
              function_tests = function_tests + 1;
              test_ret_7 = 0;
              for (uVar37 = 0; uVar37 != 8; uVar37 = uVar37 + 1) {
                iVar5 = xmlMemBlocks();
                pcVar33 = gen_filepath(uVar37,(int)_test_ret_2);
                pxVar22 = (xmlDocPtr)xmlRecoverFile(pcVar33);
                desret_xmlDocPtr(pxVar22);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlRecoverFile",(ulong)(uint)(iVar6 - iVar5));
                  test_ret_7 = test_ret_7 + 1;
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  printf(" %d");
                  putchar(10);
                }
              }
              function_tests = function_tests + 1;
              local_74 = 0;
              for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
                pxVar22 = (xmlDocPtr)0x0;
                while (iVar5 = (int)pxVar22, iVar5 != 4) {
                  iVar6 = xmlMemBlocks();
                  if (uVar37 == 0) {
                    bVar31 = false;
                    pcVar33 = "foo";
                  }
                  else if (uVar37 == 2) {
                    bVar31 = false;
                    pcVar33 = "test/ent2";
                  }
                  else if (uVar37 == 1) {
                    bVar31 = false;
                    pcVar33 = "<foo/>";
                  }
                  else {
                    bVar31 = true;
                    pcVar33 = (char *)0x0;
                  }
                  uVar35 = gen_int(iVar5,(int)_test_ret_2);
                  pxVar18 = (xmlDocPtr)(ulong)uVar35;
                  if ((bVar31) || (sVar17 = strlen(pcVar33), (int)uVar35 <= (int)sVar17 + 1)) {
                    val = (xmlDocPtr)xmlRecoverMemory(pcVar33);
                    desret_xmlDocPtr(val);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar7 = xmlMemBlocks();
                    _test_ret_2 = pxVar18;
                    if (iVar6 != iVar7) {
                      iVar7 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRecoverMemory",
                             (ulong)(uint)(iVar7 - iVar6));
                      local_74 = local_74 + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                  }
                  pxVar22 = (xmlDocPtr)(ulong)(iVar5 + 1);
                }
              }
              function_tests = function_tests + 1;
              local_48 = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                uVar20 = 0;
                while (iVar5 = (int)uVar20, iVar5 != 5) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar6 = (int)_test_ret_2;
                    iVar7 = (int)pxVar22;
                    if (iVar7 == 5) break;
                    iVar8 = xmlMemBlocks();
                    if (uVar37 == 0) {
                      uVar23 = __xmlDefaultSAXHandler();
                    }
                    else {
                      uVar23 = 0;
                    }
                    _test_ret_2 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar6);
                    pxVar16 = gen_const_xmlChar_ptr(iVar7,iVar6);
                    pxVar24 = (xmlNodePtr)xmlSAXParseDTD(uVar23,_test_ret_2,pxVar16);
                    desret_xmlNodePtr(pxVar24);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar6 = xmlMemBlocks();
                    if (iVar8 != iVar6) {
                      iVar6 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSAXParseDTD",
                             (ulong)(uint)(iVar6 - iVar8));
                      local_48 = local_48 + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar7 + 1);
                  }
                  uVar20 = (ulong)(iVar5 + 1);
                }
              }
              function_tests = function_tests + 1;
              local_4c = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                uVar20 = 0;
                while (iVar5 = (int)uVar20, iVar5 != 5) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar6 = (int)_test_ret_2;
                    iVar7 = (int)pxVar22;
                    if (iVar7 == 4) break;
                    iVar8 = xmlMemBlocks();
                    if (uVar37 == 0) {
                      uVar23 = __xmlDefaultSAXHandler();
                    }
                    else {
                      uVar23 = 0;
                    }
                    _test_ret_2 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar6);
                    iVar6 = gen_int(iVar7,iVar6);
                    pxVar18 = (xmlDocPtr)xmlSAXParseDoc(uVar23,_test_ret_2,iVar6);
                    desret_xmlDocPtr(pxVar18);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar6 = xmlMemBlocks();
                    if (iVar8 != iVar6) {
                      iVar6 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSAXParseDoc",
                             (ulong)(uint)(iVar6 - iVar8));
                      local_4c = local_4c + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar7 + 1);
                  }
                  uVar20 = (ulong)(iVar5 + 1);
                }
              }
              function_tests = function_tests + 1;
              test_ret_8 = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                pxVar22 = (xmlDocPtr)0x0;
                while( true ) {
                  iVar5 = (int)_test_ret_2;
                  iVar6 = (int)pxVar22;
                  if (iVar6 == 8) break;
                  iVar7 = xmlMemBlocks();
                  if (uVar37 == 0) {
                    uVar23 = __xmlDefaultSAXHandler();
                  }
                  else {
                    uVar23 = 0;
                  }
                  _test_ret_2 = (xmlDocPtr)gen_filepath(iVar6,iVar5);
                  pxVar18 = (xmlDocPtr)xmlSAXParseEntity(uVar23);
                  desret_xmlDocPtr(pxVar18);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar5 = xmlMemBlocks();
                  if (iVar7 != iVar5) {
                    iVar5 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlSAXParseEntity",
                           (ulong)(uint)(iVar5 - iVar7));
                    test_ret_8 = test_ret_8 + 1;
                    printf(" %d",(ulong)uVar37);
                    printf(" %d");
                    putchar(10);
                    _test_ret_2 = pxVar22;
                  }
                  pxVar22 = (xmlDocPtr)(ulong)(iVar6 + 1);
                }
              }
              function_tests = function_tests + 1;
              local_50 = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                uVar20 = 0;
                while (iVar5 = (int)uVar20, iVar5 != 8) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar6 = (int)_test_ret_2;
                    iVar7 = (int)pxVar22;
                    if (iVar7 == 4) break;
                    iVar8 = xmlMemBlocks();
                    if (uVar37 == 0) {
                      uVar23 = __xmlDefaultSAXHandler();
                    }
                    else {
                      uVar23 = 0;
                    }
                    _test_ret_2 = (xmlDocPtr)gen_filepath(iVar5,iVar6);
                    iVar6 = gen_int(iVar7,iVar6);
                    pxVar18 = (xmlDocPtr)xmlSAXParseFile(uVar23,_test_ret_2,iVar6);
                    desret_xmlDocPtr(pxVar18);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar6 = xmlMemBlocks();
                    if (iVar8 != iVar6) {
                      iVar6 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSAXParseFile",
                             (ulong)(uint)(iVar6 - iVar8));
                      local_50 = local_50 + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar7 + 1);
                  }
                  uVar20 = (ulong)(iVar5 + 1);
                }
              }
              function_tests = function_tests + 1;
              local_d8 = 0;
              for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
                uVar20 = 0;
                while (iVar6 = (int)uVar20, iVar6 != 8) {
                  uVar19 = 0;
                  while (iVar7 = (int)uVar19, iVar7 != 4) {
                    pxVar22 = (xmlDocPtr)0x0;
                    while( true ) {
                      iVar9 = (int)_test_ret_2;
                      iVar8 = (int)pxVar22;
                      if (iVar8 == 3) break;
                      iVar10 = xmlMemBlocks();
                      if (iVar5 == 0) {
                        uVar23 = __xmlDefaultSAXHandler();
                      }
                      else {
                        uVar23 = 0;
                      }
                      _test_ret_2 = (xmlDocPtr)gen_filepath(iVar6,iVar9);
                      iVar9 = gen_int(iVar7,iVar9);
                      piVar30 = &call_tests;
                      if (iVar8 != 0) {
                        if (iVar8 == 1) {
                          piVar30 = (int *)0xffffffffffffffff;
                        }
                        else {
                          piVar30 = (int *)0x0;
                        }
                      }
                      pxVar18 = (xmlDocPtr)xmlSAXParseFileWithData(uVar23,_test_ret_2,iVar9,piVar30)
                      ;
                      desret_xmlDocPtr(pxVar18);
                      call_tests = call_tests + 1;
                      xmlResetLastError();
                      iVar9 = xmlMemBlocks();
                      if (iVar10 != iVar9) {
                        iVar9 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlSAXParseFileWithData",
                               (ulong)(uint)(iVar9 - iVar10));
                        local_d8 = local_d8 + 1;
                        printf(" %d",iVar5);
                        printf(" %d",uVar20);
                        printf(" %d",uVar19);
                        printf(" %d");
                        putchar(10);
                        _test_ret_2 = pxVar22;
                      }
                      pxVar22 = (xmlDocPtr)(ulong)(iVar8 + 1);
                    }
                    uVar19 = (ulong)(iVar7 + 1);
                  }
                  uVar20 = (ulong)(iVar6 + 1);
                }
              }
              function_tests = function_tests + 1;
              iVar5 = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
                  for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
                    pxVar22 = (xmlDocPtr)0x0;
                    while (iVar6 = (int)pxVar22, iVar6 != 4) {
                      iVar7 = xmlMemBlocks();
                      if (uVar37 == 0) {
                        local_f0 = __xmlDefaultSAXHandler();
                      }
                      else {
                        local_f0 = 0;
                      }
                      if (uVar35 == 0) {
                        bVar31 = false;
                        pcVar33 = "foo";
                      }
                      else if (uVar35 == 2) {
                        bVar31 = false;
                        pcVar33 = "test/ent2";
                      }
                      else if (uVar35 == 1) {
                        bVar31 = false;
                        pcVar33 = "<foo/>";
                      }
                      else {
                        bVar31 = true;
                        pcVar33 = (char *)0x0;
                      }
                      iVar8 = gen_int(uVar32,(int)_test_ret_2);
                      iVar9 = gen_int(iVar6,(int)_test_ret_2);
                      if ((bVar31) || (sVar17 = strlen(pcVar33), iVar8 <= (int)sVar17 + 1)) {
                        pxVar18 = (xmlDocPtr)xmlSAXParseMemory(local_f0,pcVar33,iVar8,iVar9);
                        desret_xmlDocPtr(pxVar18);
                        call_tests = call_tests + 1;
                        xmlResetLastError();
                        iVar8 = xmlMemBlocks();
                        _test_ret_2 = (xmlDocPtr)pcVar33;
                        if (iVar7 != iVar8) {
                          iVar8 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlSAXParseMemory",
                                 (ulong)(uint)(iVar8 - iVar7));
                          iVar5 = iVar5 + 1;
                          printf(" %d",(ulong)uVar37);
                          printf(" %d",(ulong)uVar35);
                          printf(" %d",(ulong)uVar32);
                          printf(" %d");
                          putchar(10);
                          _test_ret_2 = pxVar22;
                        }
                      }
                      pxVar22 = (xmlDocPtr)(ulong)(iVar6 + 1);
                    }
                  }
                }
              }
              function_tests = function_tests + 1;
              iVar6 = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                for (uVar35 = 0; uVar35 != 4; uVar35 = uVar35 + 1) {
                  for (uVar32 = 0; uVar32 != 4; uVar32 = uVar32 + 1) {
                    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
                      for (uVar29 = 0; uVar29 != 3; uVar29 = uVar29 + 1) {
                        iVar8 = xmlMemBlocks();
                        if (uVar37 == 0) {
                          local_108 = (uint *)__xmlDefaultSAXHandler();
                        }
                        else {
                          local_108 = (uint *)0x0;
                        }
                        if (uVar35 == 0) {
                          bVar31 = false;
                          pcVar33 = "foo";
                        }
                        else if (uVar35 == 2) {
                          bVar31 = false;
                          pcVar33 = "test/ent2";
                        }
                        else if (uVar35 == 1) {
                          bVar31 = false;
                          pcVar33 = "<foo/>";
                        }
                        else {
                          bVar31 = true;
                          pcVar33 = (char *)0x0;
                        }
                        iVar9 = gen_int(uVar32,(int)_test_ret_2);
                        iVar10 = gen_int(iVar7,(int)_test_ret_2);
                        piVar30 = &call_tests;
                        if (uVar29 != 0) {
                          if (uVar29 == 1) {
                            piVar30 = (int *)0xffffffffffffffff;
                          }
                          else {
                            piVar30 = (int *)0x0;
                          }
                        }
                        if ((bVar31) || (sVar17 = strlen(pcVar33), iVar9 <= (int)sVar17 + 1)) {
                          pxVar22 = (xmlDocPtr)
                                    xmlSAXParseMemoryWithData
                                              (local_108,pcVar33,iVar9,iVar10,piVar30);
                          desret_xmlDocPtr(pxVar22);
                          call_tests = call_tests + 1;
                          xmlResetLastError();
                          iVar9 = xmlMemBlocks();
                          _test_ret_2 = (xmlDocPtr)pcVar33;
                          if (iVar8 != iVar9) {
                            iVar9 = xmlMemBlocks();
                            printf("Leak of %d blocks found in xmlSAXParseMemoryWithData",
                                   (ulong)(uint)(iVar9 - iVar8));
                            iVar6 = iVar6 + 1;
                            printf(" %d",(ulong)uVar37);
                            printf(" %d",(ulong)uVar35);
                            printf(" %d",(ulong)uVar32);
                            printf(" %d",iVar7);
                            _test_ret_2 = (xmlDocPtr)(ulong)uVar29;
                            printf(" %d");
                            putchar(10);
                          }
                        }
                      }
                    }
                  }
                }
              }
              function_tests = function_tests + 1;
              local_f4 = 0;
              for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
                uVar20 = 0;
                while (iVar8 = (int)uVar20, iVar8 != 3) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar9 = (int)_test_ret_2;
                    iVar10 = (int)pxVar22;
                    if (iVar10 == 8) break;
                    iVar12 = xmlMemBlocks();
                    if (iVar7 == 0) {
                      lVar25 = __xmlDefaultSAXHandler();
                    }
                    else {
                      lVar25 = 0;
                    }
                    piVar30 = &call_tests;
                    if (iVar8 != 0) {
                      if (iVar8 == 1) {
                        piVar30 = (int *)0xffffffffffffffff;
                      }
                      else {
                        piVar30 = (int *)0x0;
                      }
                    }
                    pcVar33 = gen_filepath(iVar10,iVar9);
                    lVar27 = __xmlDefaultSAXHandler();
                    _test_ret_2 = (xmlDocPtr)0x0;
                    if (lVar25 != lVar27) {
                      _test_ret_2 = (xmlDocPtr)piVar30;
                    }
                    xmlSAXUserParseFile(lVar25,_test_ret_2,pcVar33);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar9 = xmlMemBlocks();
                    if (iVar12 != iVar9) {
                      iVar9 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSAXUserParseFile",
                             (ulong)(uint)(iVar9 - iVar12));
                      local_f4 = local_f4 + 1;
                      printf(" %d",iVar7);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar10 + 1);
                  }
                  uVar20 = (ulong)(iVar8 + 1);
                }
              }
              function_tests = function_tests + 1;
              iVar7 = 0;
              for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
                for (uVar35 = 0; uVar35 != 3; uVar35 = uVar35 + 1) {
                  for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
                    pxVar22 = (xmlDocPtr)0x0;
                    while (iVar9 = (int)pxVar22, iVar9 != 4) {
                      iVar10 = xmlMemBlocks();
                      if (uVar37 == 0) {
                        lVar25 = __xmlDefaultSAXHandler();
                      }
                      else {
                        lVar25 = 0;
                      }
                      piVar30 = &call_tests;
                      if (uVar35 != 0) {
                        if (uVar35 == 1) {
                          piVar30 = (int *)0xffffffffffffffff;
                        }
                        else {
                          piVar30 = (int *)0x0;
                        }
                      }
                      if (iVar8 == 0) {
                        bVar31 = false;
                        pcVar33 = "foo";
                      }
                      else if (iVar8 == 2) {
                        bVar31 = false;
                        pcVar33 = "test/ent2";
                      }
                      else if (iVar8 == 1) {
                        bVar31 = false;
                        pcVar33 = "<foo/>";
                      }
                      else {
                        bVar31 = true;
                        pcVar33 = (char *)0x0;
                      }
                      iVar12 = gen_int(iVar9,(int)_test_ret_2);
                      if ((bVar31) || (sVar17 = strlen(pcVar33), iVar12 <= (int)sVar17 + 1)) {
                        lVar27 = __xmlDefaultSAXHandler();
                        _test_ret_2 = (xmlDocPtr)piVar30;
                        if (lVar25 == lVar27) {
                          _test_ret_2 = (xmlDocPtr)0x0;
                        }
                        xmlSAXUserParseMemory(lVar25,_test_ret_2,pcVar33,iVar12);
                        call_tests = call_tests + 1;
                        xmlResetLastError();
                        iVar12 = xmlMemBlocks();
                        if (iVar10 != iVar12) {
                          iVar12 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlSAXUserParseMemory",
                                 (ulong)(uint)(iVar12 - iVar10));
                          iVar7 = iVar7 + 1;
                          printf(" %d",(ulong)uVar37);
                          printf(" %d",(ulong)uVar35);
                          printf(" %d",iVar8);
                          printf(" %d");
                          putchar(10);
                          _test_ret_2 = pxVar22;
                        }
                      }
                      pxVar22 = (xmlDocPtr)(ulong)(iVar9 + 1);
                    }
                  }
                }
              }
              function_tests = function_tests + 1;
              iVar8 = 0;
              for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
                uVar20 = 0;
                while (uVar35 = (uint)uVar20, uVar35 != 4) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar9 = (int)_test_ret_2;
                    iVar10 = (int)pxVar22;
                    if (iVar10 == 2) break;
                    iVar12 = xmlMemBlocks();
                    pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar9);
                    if (uVar35 < 3) {
                      _test_ret_2 = (xmlDocPtr)(&DAT_00167d78)[uVar20];
                    }
                    else {
                      _test_ret_2 = (xmlDocPtr)0x0;
                    }
                    xmlSetFeature(pxVar15,_test_ret_2,0);
                    call_tests = call_tests + 1;
                    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                      xmlFreeParserCtxt(pxVar15);
                    }
                    xmlResetLastError();
                    iVar9 = xmlMemBlocks();
                    if (iVar12 != iVar9) {
                      iVar9 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSetFeature",
                             (ulong)(uint)(iVar9 - iVar12));
                      iVar8 = iVar8 + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar10 + 1);
                  }
                  uVar20 = (ulong)(uVar35 + 1);
                }
              }
              function_tests = function_tests + 1;
              iVar9 = 0;
              for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
                uVar20 = 0;
                while (iVar10 = (int)uVar20, iVar10 != 5) {
                  pxVar22 = (xmlDocPtr)0x0;
                  while( true ) {
                    iVar12 = (int)_test_ret_2;
                    iVar14 = (int)pxVar22;
                    if (iVar14 == 8) break;
                    iVar13 = xmlMemBlocks();
                    pxVar15 = gen_xmlParserCtxtPtr(uVar37,iVar12);
                    _test_ret_2 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar10,iVar12);
                    pcVar33 = gen_filepath(iVar14,iVar12);
                    xmlSetupParserForBuffer(pxVar15,_test_ret_2,pcVar33);
                    call_tests = call_tests + 1;
                    if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                      xmlFreeParserCtxt(pxVar15);
                    }
                    xmlResetLastError();
                    iVar12 = xmlMemBlocks();
                    if (iVar13 != iVar12) {
                      iVar12 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlSetupParserForBuffer",
                             (ulong)(uint)(iVar12 - iVar13));
                      iVar9 = iVar9 + 1;
                      printf(" %d",(ulong)uVar37);
                      printf(" %d",uVar20);
                      printf(" %d");
                      putchar(10);
                      _test_ret_2 = pxVar22;
                    }
                    pxVar22 = (xmlDocPtr)(ulong)(iVar14 + 1);
                  }
                  uVar20 = (ulong)(iVar10 + 1);
                }
              }
              function_tests = function_tests + 1;
              iVar10 = 0;
              for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
                iVar12 = xmlMemBlocks();
                pxVar15 = gen_xmlParserCtxtPtr(uVar37,(int)_test_ret_2);
                xmlStopParser(pxVar15);
                call_tests = call_tests + 1;
                if (pxVar15 != (xmlParserCtxtPtr)0x0) {
                  xmlFreeParserCtxt(pxVar15);
                }
                xmlResetLastError();
                iVar14 = xmlMemBlocks();
                if (iVar12 != iVar14) {
                  iVar14 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlStopParser",(ulong)(uint)(iVar14 - iVar12));
                  iVar10 = iVar10 + 1;
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  printf(" %d");
                  putchar(10);
                }
              }
              function_tests = function_tests + 1;
              iVar12 = 0;
              for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
                iVar14 = xmlMemBlocks();
                iVar13 = gen_int(uVar37,(int)_test_ret_2);
                xmlSubstituteEntitiesDefault(iVar13);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar13 = xmlMemBlocks();
                if (iVar14 != iVar13) {
                  iVar13 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlSubstituteEntitiesDefault",
                         (ulong)(uint)(iVar13 - iVar14));
                  iVar12 = iVar12 + 1;
                  _test_ret_2 = (xmlDocPtr)(ulong)uVar37;
                  printf(" %d");
                  putchar(10);
                }
              }
              function_tests = function_tests + 1;
              uVar37 = iVar5 + iVar6 + local_f4 + iVar7 + iVar8 + iVar9 + iVar10 + iVar12 +
                       local_9c + test_ret_7 + local_74 + local_48 + local_4c + test_ret_8 +
                       local_50 + local_d8 +
                       local_6c + local_58 + local_5c + test_ret_6 + local_c8 + local_44 + local_c4
                       + local_bc + test_ret_5 + iVar4 + local_70 + local_64 + local_68 +
                         local_54 + local_84 + local_88 + local_8c + test_ret_4 +
                         local_c0 + iVar2 + test_ret + local_cc +
                         test_ret_3 + local_3c + local_40 +
                         local_78 + local_7c + (iVar3 != iVar1) + local_a4 + local_d4;
              if (uVar37 != 0) {
                printf("Module parser: %d errors\n",(ulong)uVar37);
              }
              return uVar37;
            }
            bVar31 = true;
            while (bVar31) {
              iVar5 = xmlMemBlocks();
              bVar31 = false;
              _test_ret_2 = (xmlDocPtr)0x0;
              xmlParserFindNodeInfoIndex(0);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 == iVar6) goto LAB_0012ae69;
              xmlMemBlocks();
              bVar31 = false;
              printf("Leak of %d blocks found in xmlParserFindNodeInfoIndex");
              local_6c = local_6c + 1;
              printf(" %d");
              _test_ret_2 = (xmlDocPtr)0x0;
              printf(" %d");
              putchar(10);
            }
            bVar31 = false;
          } while( true );
        }
        bVar31 = true;
        while (bVar31) {
          iVar5 = xmlMemBlocks();
          bVar31 = false;
          _test_ret_2 = (xmlDocPtr)0x0;
          xmlParserFindNodeInfo();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 == iVar6) goto LAB_0012adc8;
          xmlMemBlocks();
          bVar31 = false;
          printf("Leak of %d blocks found in xmlParserFindNodeInfo");
          local_68 = local_68 + 1;
          printf(" %d");
          _test_ret_2 = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        bVar31 = false;
      } while( true );
    }
    bVar31 = true;
    while (iVar6 = (int)_test_ret_2, bVar31) {
      iVar7 = xmlMemBlocks();
      pxVar15 = gen_xmlParserCtxtPtr(iVar5,iVar6);
      _test_ret_2 = (xmlDocPtr)0x0;
      xmlParserAddNodeInfo();
      call_tests = call_tests + 1;
      if (pxVar15 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar7 == iVar6) break;
      iVar6 = xmlMemBlocks();
      bVar31 = false;
      printf("Leak of %d blocks found in xmlParserAddNodeInfo",(ulong)(uint)(iVar6 - iVar7));
      local_64 = local_64 + 1;
      printf(" %d");
      _test_ret_2 = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static int
test_parser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parser : 61 of 70 functions ...\n");
    test_ret += test_xmlByteConsumed();
    test_ret += test_xmlClearNodeInfoSeq();
    test_ret += test_xmlClearParserCtxt();
    test_ret += test_xmlCreateDocParserCtxt();
    test_ret += test_xmlCreatePushParserCtxt();
    test_ret += test_xmlCtxtReadDoc();
    test_ret += test_xmlCtxtReadFile();
    test_ret += test_xmlCtxtReadMemory();
    test_ret += test_xmlCtxtReset();
    test_ret += test_xmlCtxtResetPush();
    test_ret += test_xmlCtxtUseOptions();
    test_ret += test_xmlGetExternalEntityLoader();
    test_ret += test_xmlGetFeature();
    test_ret += test_xmlGetFeaturesList();
    test_ret += test_xmlHasFeature();
    test_ret += test_xmlIOParseDTD();
    test_ret += test_xmlInitNodeInfoSeq();
    test_ret += test_xmlInitParser();
    test_ret += test_xmlInitParserCtxt();
    test_ret += test_xmlKeepBlanksDefault();
    test_ret += test_xmlLineNumbersDefault();
    test_ret += test_xmlLoadExternalEntity();
    test_ret += test_xmlNewIOInputStream();
    test_ret += test_xmlNewParserCtxt();
    test_ret += test_xmlParseBalancedChunkMemory();
    test_ret += test_xmlParseBalancedChunkMemoryRecover();
    test_ret += test_xmlParseChunk();
    test_ret += test_xmlParseCtxtExternalEntity();
    test_ret += test_xmlParseDTD();
    test_ret += test_xmlParseDoc();
    test_ret += test_xmlParseDocument();
    test_ret += test_xmlParseEntity();
    test_ret += test_xmlParseExtParsedEnt();
    test_ret += test_xmlParseExternalEntity();
    test_ret += test_xmlParseFile();
    test_ret += test_xmlParseInNodeContext();
    test_ret += test_xmlParseMemory();
    test_ret += test_xmlParserAddNodeInfo();
    test_ret += test_xmlParserFindNodeInfo();
    test_ret += test_xmlParserFindNodeInfoIndex();
    test_ret += test_xmlParserInputGrow();
    test_ret += test_xmlParserInputRead();
    test_ret += test_xmlPedanticParserDefault();
    test_ret += test_xmlReadDoc();
    test_ret += test_xmlReadFile();
    test_ret += test_xmlReadMemory();
    test_ret += test_xmlRecoverDoc();
    test_ret += test_xmlRecoverFile();
    test_ret += test_xmlRecoverMemory();
    test_ret += test_xmlSAXParseDTD();
    test_ret += test_xmlSAXParseDoc();
    test_ret += test_xmlSAXParseEntity();
    test_ret += test_xmlSAXParseFile();
    test_ret += test_xmlSAXParseFileWithData();
    test_ret += test_xmlSAXParseMemory();
    test_ret += test_xmlSAXParseMemoryWithData();
    test_ret += test_xmlSAXUserParseFile();
    test_ret += test_xmlSAXUserParseMemory();
    test_ret += test_xmlSetExternalEntityLoader();
    test_ret += test_xmlSetFeature();
    test_ret += test_xmlSetupParserForBuffer();
    test_ret += test_xmlStopParser();
    test_ret += test_xmlSubstituteEntitiesDefault();

    if (test_ret != 0)
	printf("Module parser: %d errors\n", test_ret);
    return(test_ret);
}